

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::ColumnIndex::~ColumnIndex(ColumnIndex *this)

{
  ColumnIndex *in_RDI;
  void **in_stack_ffffffffffffffe8;
  
  ~ColumnIndex(in_RDI,in_stack_ffffffffffffffe8);
  duckdb_apache::thrift::TBase::~TBase((TBase *)in_RDI);
  return;
}

Assistant:

ColumnIndex::~ColumnIndex() noexcept {
}